

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallGetRuntimeDependenciesGenerator::GenerateScriptForConfig
          (cmInstallGetRuntimeDependenciesGenerator *this,ostream *os,string *config,Indent indent)

{
  cmMakefile *this_00;
  pointer pcVar1;
  char *__s;
  Item *pIVar2;
  pointer puVar3;
  char *pcVar4;
  cmInstallGetRuntimeDependenciesGenerator *pcVar5;
  string *psVar6;
  size_t sVar7;
  ostream *poVar8;
  _Rb_tree_node_base *p_Var9;
  bool bVar10;
  Indent IVar11;
  unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
  *item;
  pointer puVar12;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postExcludeFiles;
  anon_class_48_3_25f25bd9 addPostExclude;
  string installNameTool;
  char local_b1;
  undefined1 local_b0 [8];
  undefined1 local_a8 [24];
  _Rb_tree_node_base *local_90;
  size_t local_88;
  long *local_80 [2];
  long local_70 [2];
  string_view *local_60;
  cmInstallGetRuntimeDependenciesGenerator *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  this_00 = this->LocalGenerator->Makefile;
  pcVar4 = local_a8 + 8;
  local_b0 = (undefined1  [8])pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"CMAKE_INSTALL_NAME_TOOL","");
  psVar6 = cmMakefile::GetSafeDefinition(this_00,(string *)local_b0);
  local_50 = local_40;
  pcVar1 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + psVar6->_M_string_length);
  if (local_b0 != (undefined1  [8])pcVar4) {
    operator_delete((void *)local_b0,local_a8._8_8_ + 1);
  }
  IVar11.Level = indent.Level;
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar11.Level = IVar11.Level + -1;
    } while (IVar11.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"file(GET_RUNTIME_DEPENDENCIES\n",0x1e);
  IVar11.Level = indent.Level;
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar11.Level = IVar11.Level + -1;
    } while (IVar11.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"  RESOLVED_DEPENDENCIES_VAR ",0x1c);
  __s = this->DepsVar;
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar7);
  }
  local_b0[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_b0,1);
  local_b0 = (undefined1  [8])0xb;
  local_a8._0_8_ = "EXECUTABLES";
  anon_unknown.dwarf_2716361::WriteFilesArgument
            (os,(string_view *)local_b0,&this->RuntimeDependencySet->Executables,config,
             (cmScriptGeneratorIndent)indent.Level);
  local_b0 = (undefined1  [8])0x9;
  local_a8._0_8_ = "LIBRARIES";
  anon_unknown.dwarf_2716361::WriteFilesArgument
            (os,(string_view *)local_b0,&this->RuntimeDependencySet->Libraries,config,
             (cmScriptGeneratorIndent)indent.Level);
  local_b0 = (undefined1  [8])0x7;
  local_a8._0_8_ = "MODULES";
  anon_unknown.dwarf_2716361::WriteFilesArgument
            (os,(string_view *)local_b0,&this->RuntimeDependencySet->Modules,config,
             (cmScriptGeneratorIndent)indent.Level);
  if (this->RuntimeDependencySet->BundleExecutable != (Item *)0x0) {
    IVar11.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar11.Level = IVar11.Level + -1;
      } while (IVar11.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"  BUNDLE_EXECUTABLE \"",0x15);
    pIVar2 = this->RuntimeDependencySet->BundleExecutable;
    (*pIVar2->_vptr_Item[2])(local_b0,pIVar2,config);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_b0,local_a8._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
    if (local_b0 != (undefined1  [8])pcVar4) {
      operator_delete((void *)local_b0,local_a8._8_8_ + 1);
    }
  }
  local_b0 = (undefined1  [8])0xb;
  local_a8._0_8_ = "DIRECTORIES";
  anon_unknown.dwarf_2716361::WriteGenexEvaluatorArgument
            (os,(string_view *)local_b0,&this->Directories,config,this->LocalGenerator,
             (cmScriptGeneratorIndent)indent.Level);
  local_b0 = (undefined1  [8])0x13;
  local_a8._0_8_ = "PRE_INCLUDE_REGEXES";
  anon_unknown.dwarf_2716361::WriteGenexEvaluatorArgument
            (os,(string_view *)local_b0,&this->PreIncludeRegexes,config,this->LocalGenerator,
             (cmScriptGeneratorIndent)indent.Level);
  local_b0 = (undefined1  [8])0x13;
  local_a8._0_8_ = "PRE_EXCLUDE_REGEXES";
  anon_unknown.dwarf_2716361::WriteGenexEvaluatorArgument
            (os,(string_view *)local_b0,&this->PreExcludeRegexes,config,this->LocalGenerator,
             (cmScriptGeneratorIndent)indent.Level);
  local_b0 = (undefined1  [8])0x14;
  local_a8._0_8_ = "POST_INCLUDE_REGEXES";
  anon_unknown.dwarf_2716361::WriteGenexEvaluatorArgument
            (os,(string_view *)local_b0,&this->PostIncludeRegexes,config,this->LocalGenerator,
             (cmScriptGeneratorIndent)indent.Level);
  local_b0 = (undefined1  [8])0x14;
  local_a8._0_8_ = "POST_EXCLUDE_REGEXES";
  anon_unknown.dwarf_2716361::WriteGenexEvaluatorArgument
            (os,(string_view *)local_b0,&this->PostExcludeRegexes,config,this->LocalGenerator,
             (cmScriptGeneratorIndent)indent.Level);
  local_b0 = (undefined1  [8])0x12;
  local_a8._0_8_ = "POST_INCLUDE_FILES";
  anon_unknown.dwarf_2716361::WriteGenexEvaluatorArgument
            (os,(string_view *)local_b0,&this->PostIncludeFiles,config,this->LocalGenerator,
             (cmScriptGeneratorIndent)indent.Level);
  local_b0 = (undefined1  [8])0x12;
  local_a8._0_8_ = "POST_EXCLUDE_FILES";
  anon_unknown.dwarf_2716361::WriteGenexEvaluatorArgument
            (os,(string_view *)local_b0,&this->PostExcludeFiles,config,this->LocalGenerator,
             (cmScriptGeneratorIndent)indent.Level);
  local_a8._16_8_ = local_a8;
  local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
  local_a8._8_8_ = 0;
  local_88 = 0;
  local_80[0] = local_70;
  pcVar1 = (config->_M_dataplus)._M_p;
  local_90 = (_Rb_tree_node_base *)local_a8._16_8_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + config->_M_string_length);
  puVar12 = (this->RuntimeDependencySet->Executables).
            super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->RuntimeDependencySet->Executables).
           super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = (string_view *)local_b0;
  local_58 = this;
  if (puVar12 != puVar3) {
    do {
      pIVar2 = (puVar12->_M_t).
               super___uniq_ptr_impl<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
               .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl;
      (*pIVar2->_vptr_Item[3])(pIVar2,local_80,local_60,this->RuntimeDependencySet);
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar3);
  }
  pcVar5 = local_58;
  puVar12 = (this->RuntimeDependencySet->Libraries).
            super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->RuntimeDependencySet->Libraries).
           super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 != puVar3) {
    do {
      pIVar2 = (puVar12->_M_t).
               super___uniq_ptr_impl<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
               .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl;
      (*pIVar2->_vptr_Item[3])(pIVar2,local_80,local_60,pcVar5->RuntimeDependencySet);
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar3);
  }
  pcVar5 = local_58;
  puVar12 = (this->RuntimeDependencySet->Modules).
            super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->RuntimeDependencySet->Modules).
           super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 != puVar3) {
    do {
      pIVar2 = (puVar12->_M_t).
               super___uniq_ptr_impl<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
               .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl;
      (*pIVar2->_vptr_Item[3])(pIVar2,local_80,local_60,pcVar5->RuntimeDependencySet);
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar3);
  }
  if ((_Rb_tree_node_base *)local_a8._16_8_ != (_Rb_tree_node_base *)local_a8) {
    bVar10 = true;
    p_Var9 = (_Rb_tree_node_base *)local_a8._16_8_;
    do {
      if (bVar10) {
        IVar11.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar11.Level = IVar11.Level + -1;
          } while (IVar11.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"  POST_EXCLUDE_FILES_STRICT\n",0x1c);
        bVar10 = false;
      }
      IVar11.Level = indent.Level;
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          IVar11.Level = IVar11.Level + -1;
        } while (IVar11.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"    \"",5);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != (_Rb_tree_node_base *)local_a8);
  }
  if ((local_48 != 0) && (this->NoInstallRPath == false)) {
    IVar11.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar11.Level = IVar11.Level + -1;
      } while (IVar11.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"  RPATH_PREFIX ",0xf);
    pcVar4 = this->RPathPrefix;
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,sVar7);
    }
    local_b1 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(os,&local_b1,1);
  }
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      indent.Level = indent.Level + -1;
    } while (indent.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"  )\n",4);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b0);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void cmInstallGetRuntimeDependenciesGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  std::string installNameTool =
    this->LocalGenerator->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_NAME_TOOL");

  os << indent << "file(GET_RUNTIME_DEPENDENCIES\n"
     << indent << "  RESOLVED_DEPENDENCIES_VAR " << this->DepsVar << '\n';
  WriteFilesArgument(os, "EXECUTABLES"_s,
                     this->RuntimeDependencySet->GetExecutables(), config,
                     indent);
  WriteFilesArgument(os, "LIBRARIES"_s,
                     this->RuntimeDependencySet->GetLibraries(), config,
                     indent);
  WriteFilesArgument(os, "MODULES"_s, this->RuntimeDependencySet->GetModules(),
                     config, indent);
  if (this->RuntimeDependencySet->GetBundleExecutable()) {
    os << indent << "  BUNDLE_EXECUTABLE \""
       << this->RuntimeDependencySet->GetBundleExecutable()->GetItemPath(
            config)
       << "\"\n";
  }
  WriteGenexEvaluatorArgument(os, "DIRECTORIES"_s, this->Directories, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "PRE_INCLUDE_REGEXES"_s,
                              this->PreIncludeRegexes, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "PRE_EXCLUDE_REGEXES"_s,
                              this->PreExcludeRegexes, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "POST_INCLUDE_REGEXES"_s,
                              this->PostIncludeRegexes, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "POST_EXCLUDE_REGEXES"_s,
                              this->PostExcludeRegexes, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "POST_INCLUDE_FILES"_s,
                              this->PostIncludeFiles, config,
                              this->LocalGenerator, indent);
  WriteGenexEvaluatorArgument(os, "POST_EXCLUDE_FILES"_s,
                              this->PostExcludeFiles, config,
                              this->LocalGenerator, indent);

  std::set<std::string> postExcludeFiles;
  auto const addPostExclude =
    [config, &postExcludeFiles, this](
      const std::vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item>>&
        tgts) {
      for (auto const& item : tgts) {
        item->AddPostExcludeFiles(config, postExcludeFiles,
                                  this->RuntimeDependencySet);
      }
    };
  addPostExclude(this->RuntimeDependencySet->GetExecutables());
  addPostExclude(this->RuntimeDependencySet->GetLibraries());
  addPostExclude(this->RuntimeDependencySet->GetModules());
  bool first = true;
  for (auto const& file : postExcludeFiles) {
    if (first) {
      os << indent << "  POST_EXCLUDE_FILES_STRICT\n";
      first = false;
    }
    os << indent << "    \"" << file << "\"\n";
  }

  if (!installNameTool.empty() && !this->NoInstallRPath) {
    os << indent << "  RPATH_PREFIX " << this->RPathPrefix << '\n';
  }
  os << indent << "  )\n";
}